

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

bool __thiscall cmCTestP4::ChangesParser::ProcessLine(ChangesParser *this)

{
  cmCTestP4 *pcVar1;
  char *pcVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar3 = cmsys::RegularExpression::find
                    (&this->RegexIdentify,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexIdentify).regmatch);
  if (bVar3) {
    pcVar1 = this->P4;
    pcVar2 = (this->RegexIdentify).regmatch.startp[1];
    if (pcVar2 == (char *)0x0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      local_30._M_string_length = 0;
      local_30.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,pcVar2,(this->RegexIdentify).regmatch.endp[1]);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &pcVar1->ChangeLists,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,
                      CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                               local_30.field_2._M_local_buf[0]) + 1);
    }
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexIdentify.find(this->Line)) {
      this->P4->ChangeLists.push_back(this->RegexIdentify.match(1));
    }
    return true;
  }